

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_string.c
# Opt level: O3

PVIP_BOOL PVIP_string_vprintf(PVIPString *str,char *format,__va_list_tag *ap)

{
  int iVar1;
  PVIP_BOOL PVar2;
  char *pcVar3;
  size_t __size;
  va_list copied;
  __va_list_tag local_28;
  
  local_28.reg_save_area = ap->reg_save_area;
  local_28.gp_offset = ap->gp_offset;
  local_28.fp_offset = ap->fp_offset;
  local_28.overflow_arg_area = ap->overflow_arg_area;
  iVar1 = vsnprintf(str->buf + str->len,str->buflen - str->len,format,ap);
  if (str->buflen - str->len < (ulong)(long)(iVar1 + 1)) {
    __size = str->buflen + (long)(iVar1 + 1);
    str->buflen = __size;
    pcVar3 = (char *)realloc(str->buf,__size);
    str->buf = pcVar3;
    if (pcVar3 == (char *)0x0) {
      PVar2 = 0;
    }
    else {
      PVar2 = PVIP_string_vprintf(str,format,&local_28);
    }
  }
  else {
    str->len = str->len + (long)iVar1;
    PVar2 = 1;
  }
  return PVar2;
}

Assistant:

PVIP_BOOL PVIP_string_vprintf(PVIPString *str, const char*format, va_list ap) {
    va_list copied;
    va_copy(copied, ap); // copy original va_list

    int size = vsnprintf(str->buf + str->len, str->buflen - str->len, format, ap);
    if (size+1 > str->buflen - str->len) {
        str->buflen += size + 1;
        str->buf    = realloc(str->buf, str->buflen);
        if (!str->buf) {
            return PVIP_FALSE;
        }
        return PVIP_string_vprintf(str, format, copied);
    }
    str->len += size;
    return PVIP_TRUE;
}